

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_help_flags(App *this,bool trigger_help,bool trigger_all_help)

{
  byte bVar1;
  bool bVar2;
  Option *pOVar3;
  Option *this_00;
  size_t sVar4;
  undefined8 uVar5;
  byte bVar6;
  byte in_DL;
  byte in_SIL;
  App *in_RDI;
  App *sub;
  const_iterator __end2;
  const_iterator __begin2;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__range2;
  Option *help_all_ptr;
  Option *help_ptr;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *in_stack_ffffffffffffff98;
  __normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
  *in_stack_ffffffffffffffa0;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
  local_30;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *local_28;
  undefined6 in_stack_fffffffffffffff0;
  
  bVar6 = in_SIL & 1;
  bVar1 = in_DL & 1;
  pOVar3 = get_help_ptr(in_RDI);
  this_00 = get_help_all_ptr(in_RDI);
  if ((pOVar3 != (Option *)0x0) && (sVar4 = Option::count((Option *)0x1ac570), sVar4 != 0)) {
    bVar6 = 1;
  }
  if ((this_00 != (Option *)0x0) && (sVar4 = Option::count((Option *)0x1ac58d), sVar4 != 0)) {
    bVar1 = 1;
  }
  bVar2 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::empty(in_stack_ffffffffffffffb0);
  if (bVar2) {
    if ((bVar1 & 1) != 0) {
      uVar5 = __cxa_allocate_exception(0x38);
      CallForAllHelp::CallForAllHelp((CallForAllHelp *)this_00);
      __cxa_throw(uVar5,&CallForAllHelp::typeinfo,CallForAllHelp::~CallForAllHelp);
    }
    if ((bVar6 & 1) != 0) {
      uVar5 = __cxa_allocate_exception(0x38);
      CallForHelp::CallForHelp((CallForHelp *)this_00);
      __cxa_throw(uVar5,&CallForHelp::typeinfo,CallForHelp::~CallForHelp);
    }
  }
  else {
    local_28 = &in_RDI->parsed_subcommands_;
    local_30._M_current =
         (App **)std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::begin
                           (in_stack_ffffffffffffff98);
    std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::end(in_stack_ffffffffffffff98);
    while (bVar2 = __gnu_cxx::
                   operator==<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                             (in_stack_ffffffffffffffa0,
                              (__normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                               *)in_stack_ffffffffffffff98), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>::
      operator*(&local_30);
      _process_help_flags((App *)CONCAT17(bVar6,CONCAT16(bVar1,in_stack_fffffffffffffff0)),
                          SUB81((ulong)pOVar3 >> 0x38,0),SUB81((ulong)pOVar3 >> 0x30,0));
      __gnu_cxx::
      __normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>::
      operator++(&local_30);
    }
  }
  return;
}

Assistant:

CLI11_INLINE void App::_process_help_flags(bool trigger_help, bool trigger_all_help) const {
    const Option *help_ptr = get_help_ptr();
    const Option *help_all_ptr = get_help_all_ptr();

    if(help_ptr != nullptr && help_ptr->count() > 0)
        trigger_help = true;
    if(help_all_ptr != nullptr && help_all_ptr->count() > 0)
        trigger_all_help = true;

    // If there were parsed subcommands, call those. First subcommand wins if there are multiple ones.
    if(!parsed_subcommands_.empty()) {
        for(const App *sub : parsed_subcommands_)
            sub->_process_help_flags(trigger_help, trigger_all_help);

        // Only the final subcommand should call for help. All help wins over help.
    } else if(trigger_all_help) {
        throw CallForAllHelp();
    } else if(trigger_help) {
        throw CallForHelp();
    }
}